

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_from_range(uint64_t min,uint64_t max,uint32_t step)

{
  uint min_00;
  uint max_00;
  int iVar1;
  uint64_t uVar2;
  container_t *c;
  uint in_EDX;
  roaring_bitmap_t *in_RSI;
  roaring_bitmap_t *in_RDI;
  uint32_t gap;
  container_t *container;
  uint8_t type;
  uint32_t container_max;
  uint32_t container_min;
  uint32_t key;
  uint64_t min_tmp;
  uint32_t value;
  roaring_bitmap_t *answer;
  uint in_stack_ffffffffffffffac;
  uint local_2c;
  roaring_bitmap_t *local_8;
  
  if ((roaring_bitmap_t *)0xffffffff < in_RSI) {
    in_RSI = (roaring_bitmap_t *)0x100000000;
  }
  if (in_EDX == 0) {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  else if (in_RDI < in_RSI) {
    local_8 = roaring_bitmap_create();
    if (in_EDX < 0x10000) {
      do {
        min_00 = (uint)((ulong)in_RDI >> 0x10) & 0xffff;
        max_00 = (uint)in_RDI & 0xffff;
        uVar2 = minimum_uint64((long)in_RSI - (ulong)(min_00 << 0x10),0x10000);
        iVar1 = (int)uVar2;
        c = container_from_range((uint8_t *)in_RDI,min_00,max_00,(uint16_t)(uVar2 >> 0x10));
        ra_append((roaring_array_t *)CONCAT44(min_00,max_00),(uint16_t)((uint)iVar1 >> 0x10),c,
                  (uint8_t)(in_stack_ffffffffffffffac >> 0x18));
        in_stack_ffffffffffffffac = ((iVar1 - max_00) + in_EDX) - 1;
        in_RDI = (roaring_bitmap_t *)
                 ((long)&(in_RDI->high_low_container).size +
                 (ulong)(in_stack_ffffffffffffffac - in_stack_ffffffffffffffac % in_EDX));
      } while (in_RDI < in_RSI);
    }
    else {
      for (local_2c = (uint)in_RDI; (roaring_bitmap_t *)(ulong)local_2c < in_RSI;
          local_2c = in_EDX + local_2c) {
        roaring_bitmap_add(in_RDI,(uint32_t)((ulong)in_RSI >> 0x20));
      }
    }
  }
  else {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  return local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_from_range(uint64_t min, uint64_t max,
                                            uint32_t step) {
    if (max >= UINT64_C(0x100000000)) {
        max = UINT64_C(0x100000000);
    }
    if (step == 0) return NULL;
    if (max <= min) return NULL;
    roaring_bitmap_t *answer = roaring_bitmap_create();
    if (step >= (1 << 16)) {
        for (uint32_t value = (uint32_t)min; value < max; value += step) {
            roaring_bitmap_add(answer, value);
        }
        return answer;
    }
    uint64_t min_tmp = min;
    do {
        uint32_t key = (uint32_t)min_tmp >> 16;
        uint32_t container_min = min_tmp & 0xFFFF;
        uint32_t container_max =
            (uint32_t)minimum_uint64(max - (key << 16), 1 << 16);
        uint8_t type;
        container_t *container = container_from_range(
            &type, container_min, container_max, (uint16_t)step);
        ra_append(&answer->high_low_container, (uint16_t)key, container, type);
        uint32_t gap = container_max - container_min + step - 1;
        min_tmp += gap - (gap % step);
    } while (min_tmp < max);
    // cardinality of bitmap will be ((uint64_t) max - min + step - 1 ) / step
    return answer;
}